

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O3

string * __thiscall
duckdb::ScopeToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,SetScope scope)

{
  string *extraout_RAX;
  InternalException *this_00;
  undefined7 in_register_00000011;
  char *pcVar1;
  char *pcVar2;
  string local_60;
  string local_40;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = anon_var_dwarf_6372561 + 9;
    pcVar2 = anon_var_dwarf_6372561 + 9;
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "LOCAL";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "SESSION";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "GLOBAL";
    pcVar1 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "VARIABLE";
    pcVar1 = "";
    break;
  default:
    this_00 = (InternalException *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,scope));
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"ToString not implemented for SetScope of type: %s","");
    EnumUtil::ToString<duckdb::SetScope>(&local_40,(SetScope)((ulong)this & 0xffffffff));
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return extraout_RAX;
}

Assistant:

static string ScopeToString(SetScope scope) {
	switch (scope) {
	case SetScope::AUTOMATIC:
		return "";
	case SetScope::LOCAL:
		return "LOCAL";
	case SetScope::SESSION:
		return "SESSION";
	case SetScope::GLOBAL:
		return "GLOBAL";
	case SetScope::VARIABLE:
		return "VARIABLE";
	default:
		throw InternalException("ToString not implemented for SetScope of type: %s", EnumUtil::ToString(scope));
	}
}